

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

aiString * __thiscall
comparer_context::cmp<aiString>
          (aiString *__return_storage_ptr__,comparer_context *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  string local_5e0;
  stringstream local_5b0 [8];
  stringstream ss;
  ostream local_5a0 [380];
  undefined1 local_424 [8];
  aiString e;
  string *name_local;
  comparer_context *this_local;
  aiString *a;
  
  e.data._1016_8_ = name;
  aiString::aiString(__return_storage_ptr__);
  aiString::aiString((aiString *)local_424);
  read<aiString>(this,__return_storage_ptr__,(aiString *)local_424);
  bVar1 = aiString::operator!=(__return_storage_ptr__,(aiString *)local_424);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_5b0);
  poVar2 = std::operator<<(local_5a0,"Expected ");
  pbVar3 = ::operator<<(poVar2,(aiString *)local_424);
  poVar2 = std::operator<<(pbVar3,", but actual is ");
  ::operator<<(poVar2,__return_storage_ptr__);
  std::__cxx11::stringstream::str();
  failure(this,&local_5e0,(string *)e.data._1016_8_);
}

Assistant:

T cmp(const std::string& name) {
        T a,e;
        read(a,e);

        if(a != e) {
            std::stringstream ss;
            failure((ss<< "Expected " << e << ", but actual is " << a,
                ss.str()),name);
        }
    //  std::cout << name << " " << std::hex << a << std::endl;
        return a;
    }